

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglpixeltransferoptions.cpp
# Opt level: O1

void __thiscall
QOpenGLPixelTransferOptions::setAlignment(QOpenGLPixelTransferOptions *this,int alignment)

{
  QOpenGLPixelTransferOptionsData *pQVar1;
  
  pQVar1 = (this->data).d.ptr;
  if ((pQVar1 != (QOpenGLPixelTransferOptionsData *)0x0) &&
     ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value != (__atomic_base<int>)0x1)) {
    QSharedDataPointer<QOpenGLPixelTransferOptionsData>::detach_helper(&this->data);
  }
  ((this->data).d.ptr)->alignment = alignment;
  return;
}

Assistant:

void QOpenGLPixelTransferOptions::setAlignment(int alignment)
{
    data->alignment = alignment;
}